

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadSBGx(SBG *pSBG)

{
  int local_1c;
  int id;
  SBG *pSBG_local;
  
  local_1c = 0;
  do {
    if ((SBG *)addrsSBG[local_1c] == pSBG) {
      bExitSBG[local_1c] = 1;
      WaitForThread(SBGThreadId[local_1c]);
      DeleteCriticalSection(SBGCS + local_1c);
      resSBG[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadSBGx(SBG* pSBG)
{
	int id = 0;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitSBG[id] = TRUE;
	WaitForThread(SBGThreadId[id]);
	DeleteCriticalSection(&SBGCS[id]);
	resSBG[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}